

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# channel.c
# Opt level: O0

int mgr_process(chmgr *chmgr,int idx)

{
  int iVar1;
  ssize_t sVar2;
  char *lname_00;
  int *piVar3;
  char *pcVar4;
  char *local_428;
  char *rname;
  char *lname;
  char buf [1024];
  int ret;
  int idx_local;
  chmgr *chmgr_local;
  
  buf[0x3f8] = '\0';
  buf[0x3f9] = '\0';
  buf[0x3fa] = '\0';
  buf[0x3fb] = '\0';
  buf._1020_4_ = idx;
  sVar2 = read(chmgr->fds[0].fd,&lname,0x400);
  buf._1016_4_ = (undefined4)sVar2;
  if (0 < (int)buf._1016_4_) {
    buf[(long)(int)buf._1016_4_ + -8] = '\0';
    lname_00 = strtok((char *)&lname," \n");
    local_428 = strtok((char *)0x0," \n");
    if (local_428 == (char *)0x0) {
      local_428 = lname_00;
    }
    mgr_print(chmgr,"send %s to %s\n",lname_00,local_428);
    if (chmgr->ftmgr != (ftmgr *)0x0) {
      free_ftmgr(&chmgr->ftmgr);
    }
    buf._1016_4_ = fstat_req(chmgr,lname_00,local_428);
    if ((int)buf._1016_4_ < 0) {
      piVar3 = __errno_location();
      pcVar4 = strerror(*piVar3);
      mgr_print(chmgr,"send %s to %s: %s\n",lname_00,local_428,pcVar4);
    }
  }
  iVar1._0_1_ = buf[0x3f8];
  iVar1._1_1_ = buf[0x3f9];
  iVar1._2_1_ = buf[0x3fa];
  iVar1._3_1_ = buf[0x3fb];
  return iVar1;
}

Assistant:

static int mgr_process(struct chmgr *chmgr, int idx __unused)
{
    int ret = 0;
    char buf[1024];
    char *lname, *rname;

    if(0 < (ret = read(chmgr->fds[CTRL_MGR].fd, buf, 1024))) {
        buf[ret] =  '\0';
        lname = strtok(buf, " \n");
        rname = strtok(NULL, " \n");

        if(rname == NULL)
            rname = lname;

        mgr_print(chmgr, "send %s to %s\n", lname, rname);

        if(chmgr->ftmgr != NULL)
            free_ftmgr(&chmgr->ftmgr);
        if(0 > (ret = fstat_req(chmgr, lname, rname))) {
            mgr_print(chmgr, "send %s to %s: %s\n", lname, rname, strerror(errno));
        }
    }
    return ret;
}